

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O2

void __thiscall Refal2::CArbitraryInteger::Mul(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  bool bVar1;
  bool bVar2;
  
  removeLeadingZeros(this);
  removeLeadingZeros(operand);
  bVar1 = this->isNegative;
  bVar2 = operand->isNegative;
  mul(this,operand);
  this->isNegative = bVar1 != bVar2;
  removeLeadingZeros(this);
  return;
}

Assistant:

void CArbitraryInteger::Mul( const CArbitraryInteger& operand )
{
	removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	const bool resultSign = IsNegative() != operand.IsNegative();
	mul( operand );
	SetSign( resultSign );
	removeLeadingZeros();
}